

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

void __thiscall FileWriter::writeHeader(FileWriter *this,File *file,string *path)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  json jsonHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jsonPath;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  string local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  string local_30;
  
  lrit::toJSON_abi_cxx11_((lrit *)&local_70,file);
  buildPath(&local_60,this,path);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_40,&local_60);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_70,"Path");
  vVar1 = pvVar3->m_type;
  pvVar3->m_type = local_40.m_type;
  jVar2 = pvVar3->m_value;
  pvVar3->m_value = local_40.m_value;
  local_40.m_type = vVar1;
  local_40.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  removeSuffix(&local_30,path);
  std::operator+(&local_60,&local_30,".json");
  std::__cxx11::string::~string((string *)&local_30);
  write(this,(int)&local_60,&local_70,0);
  std::__cxx11::string::~string((string *)&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_70);
  return;
}

Assistant:

void FileWriter::writeHeader(const lrit::File& file, const std::string& path) {
  auto jsonHeader = lrit::toJSON(file);
  jsonHeader["Path"] = buildPath(path);
  auto jsonPath = removeSuffix(path) + ".json";
  write(jsonPath, jsonHeader);
}